

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O0

void Handlers::Guild_Report(Character *character,PacketReader *reader)

{
  size_t *this;
  World *pWVar1;
  GuildManager *pGVar2;
  _Hash_node_code_cache<true> _Var3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  long lVar8;
  int *piVar9;
  element_type *peVar10;
  reference psVar11;
  char *pcVar12;
  char *__format;
  long lVar13;
  long lVar14;
  long lVar15;
  size_type sVar16;
  size_type sVar17;
  reference pvVar18;
  element_type *peVar19;
  reference psVar20;
  element_type *peVar21;
  int subject;
  undefined1 local_3b0 [8];
  shared_ptr<Guild_Member> member_3;
  iterator __end3_2;
  iterator __begin3_2;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> *__range3_2;
  undefined1 local_368 [8];
  shared_ptr<Guild_Member> member_2;
  iterator __end3_1;
  iterator __begin3_1;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> *__range3_1;
  string rank;
  size_t i;
  PacketBuilder reply_1;
  string bank_str;
  key_type local_2c0;
  string local_2a0;
  string local_280 [32];
  tm *local_260;
  tm *local_time;
  string create_date;
  shared_ptr<Guild_Member> member_1;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> *__range4;
  key_type local_208;
  undefined1 local_1e8 [8];
  shared_ptr<Guild_Member> member;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> *__range3;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> recruiters;
  list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> leaders;
  key_type local_188;
  int local_168;
  allocator local_161;
  int recruiter_rank;
  int local_140;
  allocator local_139;
  key_type local_138;
  int local_118;
  int local_114;
  undefined1 local_110 [4];
  int leader_rank;
  PacketBuilder reply;
  undefined1 local_c0 [48];
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  shared_ptr<Guild> guild;
  allocator local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string tag;
  PacketReader *reader_local;
  Character *character_local;
  
  tag.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code = (size_t)reader;
  PacketReader::GetInt(reader);
  PacketReader::GetEndString_abi_cxx11_
            ((string *)local_38,
             (PacketReader *)
             tag.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
             super__Hash_node_code_cache<true>._M_hash_code);
  uVar6 = std::__cxx11::string::length();
  pWVar1 = character->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"GuildMaxNameLength",&local_59);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_58);
  iVar5 = util::variant::operator_cast_to_int(pmVar7);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if ((ulong)(long)iVar5 < uVar6) {
    guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  }
  else {
    if (character->npc_type == Guild) {
      std::shared_ptr<Guild>::shared_ptr((shared_ptr<Guild> *)local_80);
      lVar8 = std::__cxx11::string::length();
      if ((lVar8 == 2) || (lVar8 = std::__cxx11::string::length(), lVar8 == 3)) {
        pGVar2 = character->world->guildmanager;
        std::__cxx11::string::string((string *)(local_c0 + 0x10),(string *)local_38);
        GuildManager::GetGuild((GuildManager *)local_90,(string *)pGVar2);
        std::shared_ptr<Guild>::operator=
                  ((shared_ptr<Guild> *)local_80,(shared_ptr<Guild> *)local_90);
        std::shared_ptr<Guild>::~shared_ptr((shared_ptr<Guild> *)local_90);
        std::__cxx11::string::~string((string *)(local_c0 + 0x10));
      }
      else {
        pGVar2 = character->world->guildmanager;
        std::__cxx11::string::string((string *)&reply.add_size,(string *)local_38);
        GuildManager::GetGuildName((GuildManager *)local_c0,(string *)pGVar2);
        std::shared_ptr<Guild>::operator=
                  ((shared_ptr<Guild> *)local_80,(shared_ptr<Guild> *)local_c0);
        std::shared_ptr<Guild>::~shared_ptr((shared_ptr<Guild> *)local_c0);
        std::__cxx11::string::~string((string *)&reply.add_size);
      }
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
      if (bVar4) {
        pWVar1 = character->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_138,"GuildEditRank",&local_139);
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_138);
        local_118 = util::variant::operator_cast_to_int(pmVar7);
        pWVar1 = character->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&recruiter_rank,"GuildKickRank",&local_161);
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,(key_type *)&recruiter_rank);
        local_140 = util::variant::operator_cast_to_int(pmVar7);
        piVar9 = std::max<int>(&local_118,&local_140);
        iVar5 = *piVar9;
        std::__cxx11::string::~string((string *)&recruiter_rank);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
        pWVar1 = character->world;
        local_114 = iVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_188,"GuildRecruitRank",
                   (allocator *)
                   ((long)&leaders.
                           super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                           ._M_impl._M_node._M_size + 7));
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_188);
        iVar5 = util::variant::operator_cast_to_int(pmVar7);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&leaders.
                           super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                           ._M_impl._M_node._M_size + 7));
        local_168 = iVar5;
        std::__cxx11::
        list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::list
                  ((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                    *)&recruiters.
                       super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                       ._M_impl._M_node._M_size);
        std::__cxx11::
        list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::list
                  ((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                    *)&__range3);
        peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_80);
        __end3 = std::
                 vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ::begin(&peVar10->members);
        member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
             ::end(&peVar10->members);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                                           *)&member.
                                              super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount), bVar4) {
          psVar11 = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                    ::operator*(&__end3);
          std::shared_ptr<Guild_Member>::shared_ptr((shared_ptr<Guild_Member> *)local_1e8,psVar11);
          peVar21 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_1e8);
          if (peVar21->rank <= local_114) {
            std::__cxx11::
            list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
            push_back((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                       *)&recruiters.
                          super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                          ._M_impl._M_node._M_size,(value_type *)local_1e8);
          }
          std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)local_1e8);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
          ::operator++(&__end3);
        }
        pWVar1 = character->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_208,"GuildShowRecruiters",(allocator *)((long)&__range4 + 7));
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_208);
        bVar4 = util::variant::operator_cast_to_bool(pmVar7);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        if (bVar4) {
          peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_80);
          __end4 = std::
                   vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                   ::begin(&peVar10->members);
          member_1.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
               ::end(&peVar10->members);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                                             *)&member_1.
                                                super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount), bVar4) {
            psVar11 = __gnu_cxx::
                      __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                      ::operator*(&__end4);
            std::shared_ptr<Guild_Member>::shared_ptr
                      ((shared_ptr<Guild_Member> *)
                       &create_date.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                        .super__Hash_node_code_cache<true>,psVar11);
            peVar21 = std::
                      __shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&create_date.
                                     super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                                     .super__Hash_node_code_cache<true>);
            if ((local_114 < peVar21->rank) &&
               (peVar21 = std::
                          __shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&create_date.
                                           super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                                           .super__Hash_node_code_cache<true>),
               peVar21->rank <= local_168)) {
              std::__cxx11::
              list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
              push_back((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                         *)&__range3,
                        (value_type *)
                        &create_date.
                         super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                         super__Hash_node_code_cache<true>);
            }
            std::shared_ptr<Guild_Member>::~shared_ptr
                      ((shared_ptr<Guild_Member> *)
                       &create_date.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                        .super__Hash_node_code_cache<true>);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
            ::operator++(&__end4);
          }
        }
        std::__cxx11::string::string((string *)&local_time);
        std::__cxx11::string::resize((ulong)&local_time);
        peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_80);
        local_260 = localtime(&peVar10->created);
        pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)&local_time);
        pWVar1 = character->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2c0,"GuildDateFormat",
                   (allocator *)
                   ((long)&bank_str.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                           .super__Hash_node_code_cache<true>._M_hash_code + 7));
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_2c0);
        util::variant::operator_cast_to_string(&local_2a0,pmVar7);
        __format = (char *)std::__cxx11::string::c_str();
        strftime(pcVar12,0x1f,__format,local_260);
        std::__cxx11::string::substr((ulong)local_280,(ulong)&local_time);
        std::__cxx11::string::operator=((string *)&local_time,local_280);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&bank_str.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>
                           .super__Hash_node_code_cache<true>._M_hash_code + 7));
        peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_80);
        util::to_string_abi_cxx11_
                  ((string *)&reply_1.add_size,(util *)(ulong)(uint)peVar10->bank,subject);
        std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_80)
        ;
        lVar8 = std::__cxx11::string::length();
        lVar13 = std::__cxx11::string::length();
        std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_80)
        ;
        lVar14 = std::__cxx11::string::length();
        lVar15 = std::__cxx11::string::length();
        sVar16 = std::__cxx11::
                 list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ::size((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                         *)&recruiters.
                            super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                            ._M_impl._M_node._M_size);
        sVar17 = std::__cxx11::
                 list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ::size((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                         *)&__range3);
        PacketBuilder::PacketBuilder
                  ((PacketBuilder *)&i,PACKET_GUILD,PACKET_REPORT,
                   lVar8 + lVar13 + lVar14 + lVar15 + sVar16 * 0xf + 0x15 + sVar17 * 0xf);
        peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_80);
        PacketBuilder::AddBreakString((PacketBuilder *)&i,&peVar10->name,0xff);
        peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_80);
        PacketBuilder::AddBreakString((PacketBuilder *)&i,&peVar10->tag,0xff);
        PacketBuilder::AddBreakString((PacketBuilder *)&i,(string *)&local_time,0xff);
        peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )local_80);
        PacketBuilder::AddBreakString((PacketBuilder *)&i,&peVar10->description,0xff);
        PacketBuilder::AddBreakString((PacketBuilder *)&i,(string *)&reply_1.add_size,0xff);
        rank.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
        super__Hash_node_code_cache<true>._M_hash_code = 0;
        while( true ) {
          _Var3._M_hash_code =
               rank.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
               super__Hash_node_code_cache<true>._M_hash_code;
          peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_80);
          sVar16 = std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                   ::size(&peVar10->ranks);
          if (sVar16 <= _Var3._M_hash_code) break;
          peVar10 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_80);
          pvVar18 = std::
                    array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                    ::operator[](&peVar10->ranks,
                                 rank.
                                 super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                                 super__Hash_node_code_cache<true>._M_hash_code);
          std::__cxx11::string::string((string *)&__range3_1,(string *)pvVar18);
          while (uVar6 = std::__cxx11::string::length(), uVar6 < 4) {
            std::__cxx11::string::operator+=((string *)&__range3_1,' ');
          }
          PacketBuilder::AddBreakString((PacketBuilder *)&i,(string *)&__range3_1,0xff);
          std::__cxx11::string::~string((string *)&__range3_1);
          rank.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
          super__Hash_node_code_cache<true>._M_hash_code =
               rank.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
               super__Hash_node_code_cache<true>._M_hash_code + 1;
        }
        sVar16 = std::__cxx11::
                 list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ::size((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                         *)&recruiters.
                            super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                            ._M_impl._M_node._M_size);
        sVar17 = std::__cxx11::
                 list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                 ::size((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                         *)&__range3);
        PacketBuilder::AddShort((PacketBuilder *)&i,(short)sVar16 + (short)sVar17);
        PacketBuilder::AddByte((PacketBuilder *)&i,0xff);
        this = &recruiters.
                super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                ._M_impl._M_node._M_size;
        __end3_1 = std::__cxx11::
                   list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                   ::begin((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                            *)this);
        member_2.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::__cxx11::
             list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
             end((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                  *)this);
        while (bVar4 = std::operator!=(&__end3_1,
                                       (_Self *)&member_2.
                                                 super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount), bVar4) {
          psVar20 = std::_List_iterator<std::shared_ptr<Guild_Member>_>::operator*(&__end3_1);
          std::shared_ptr<Guild_Member>::shared_ptr((shared_ptr<Guild_Member> *)local_368,psVar20);
          PacketBuilder::AddChar((PacketBuilder *)&i,'\x01');
          PacketBuilder::AddByte((PacketBuilder *)&i,0xff);
          peVar21 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_368);
          peVar19 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_368);
          pcVar12 = "";
          if (peVar19->rank == 0) {
            pcVar12 = " (founder)";
          }
          std::operator+((_Hash_node<std::pair<const_IPAddress,_double>,_true> *)&__range3_2,
                         &peVar21->name,pcVar12);
          PacketBuilder::AddBreakString((PacketBuilder *)&i,(string *)&__range3_2,0xff);
          std::__cxx11::string::~string((string *)&__range3_2);
          std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)local_368);
          std::_List_iterator<std::shared_ptr<Guild_Member>_>::operator++(&__end3_1);
        }
        __end3_2 = std::__cxx11::
                   list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                   ::begin((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                            *)&__range3);
        member_3.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::__cxx11::
             list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
             end((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                  *)&__range3);
        while (bVar4 = std::operator!=(&__end3_2,
                                       (_Self *)&member_3.
                                                 super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount), bVar4) {
          psVar20 = std::_List_iterator<std::shared_ptr<Guild_Member>_>::operator*(&__end3_2);
          std::shared_ptr<Guild_Member>::shared_ptr((shared_ptr<Guild_Member> *)local_3b0,psVar20);
          PacketBuilder::AddChar((PacketBuilder *)&i,'\x02');
          PacketBuilder::AddByte((PacketBuilder *)&i,0xff);
          peVar21 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3b0);
          PacketBuilder::AddBreakString((PacketBuilder *)&i,&peVar21->name,0xff);
          std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)local_3b0);
          std::_List_iterator<std::shared_ptr<Guild_Member>_>::operator++(&__end3_2);
        }
        Character::Send(character,(PacketBuilder *)&i);
        PacketBuilder::~PacketBuilder((PacketBuilder *)&i);
        std::__cxx11::string::~string((string *)&reply_1.add_size);
        std::__cxx11::string::~string((string *)&local_time);
        std::__cxx11::
        list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::~list
                  ((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                    *)&__range3);
        std::__cxx11::
        list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::~list
                  ((list<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                    *)&recruiters.
                       super__List_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                       ._M_impl._M_node._M_size);
      }
      else {
        PacketBuilder::PacketBuilder((PacketBuilder *)local_110,PACKET_GUILD,PACKET_REPLY,2);
        PacketBuilder::AddShort((PacketBuilder *)local_110,0x11);
        Character::Send(character,(PacketBuilder *)local_110);
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_110);
      }
      std::shared_ptr<Guild>::~shared_ptr((shared_ptr<Guild> *)local_80);
    }
    guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Guild_Report(Character *character, PacketReader &reader)
{
	/*int session =*/ reader.GetInt();
	std::string tag = reader.GetEndString();

	if (tag.length() > std::size_t(int(character->world->config["GuildMaxNameLength"])))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		std::shared_ptr<Guild> guild;

		if (tag.length() == 2 || tag.length() == 3)
		{
			guild = character->world->guildmanager->GetGuild(tag);
		}
		else
		{
			guild = character->world->guildmanager->GetGuildName(tag);
		}

		if (!guild)
		{
			PacketBuilder reply(PACKET_GUILD, PACKET_REPLY, 2);
			reply.AddShort(GUILD_NOT_FOUND);
			character->Send(reply);
		}
		else
		{
			int leader_rank = std::max(static_cast<int>(character->world->config["GuildEditRank"]), static_cast<int>(character->world->config["GuildKickRank"]));
			int recruiter_rank = character->world->config["GuildRecruitRank"];

			std::list<std::shared_ptr<Guild_Member>> leaders;
			std::list<std::shared_ptr<Guild_Member>> recruiters;

			UTIL_FOREACH(guild->members, member)
			{
				if (member->rank <= leader_rank)
				{
					leaders.push_back(member);
				}
			}

			if (character->world->config["GuildShowRecruiters"])
			{
				UTIL_FOREACH(guild->members, member)
				{
					if (member->rank > leader_rank && member->rank <= recruiter_rank)
					{
						recruiters.push_back(member);
					}
				}
			}

			std::string create_date;
			create_date.resize(31);

			tm *local_time = localtime(&guild->created);
			create_date = create_date.substr(0, strftime(&create_date[0], 31, static_cast<std::string>(character->world->config["GuildDateFormat"]).c_str(), local_time));

			std::string bank_str = util::to_string(guild->bank);

			PacketBuilder reply(PACKET_GUILD, PACKET_REPORT,
				21 + guild->name.length() + create_date.length() + guild->description.length() + bank_str.length()
				+ leaders.size() * 15 + recruiters.size() * 15);

			reply.AddBreakString(guild->name);
			reply.AddBreakString(guild->tag);
			reply.AddBreakString(create_date);
			reply.AddBreakString(guild->description);
			reply.AddBreakString(bank_str);

			for (std::size_t i = 0; i < guild->ranks.size(); ++i)
			{
				std::string rank = guild->ranks[i];

				while (rank.length() < 4)
				{
					rank += ' ';
				}

				reply.AddBreakString(rank);
			}

			reply.AddShort(leaders.size() + recruiters.size());
			reply.AddByte(255);

			UTIL_FOREACH(leaders, member)
			{
				reply.AddChar(1);
				reply.AddByte(255);
				reply.AddBreakString(member->name + (member->rank == 0 ? " (founder)" : ""));
			}

			UTIL_FOREACH(recruiters, member)
			{
				reply.AddChar(2);
				reply.AddByte(255);
				reply.AddBreakString(member->name);
			}

			character->Send(reply);
		}
	}
}